

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O2

void zdrot(int n,complex<double> *cx,int incx,complex<double> *cy,int incy,double c,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  bool bVar8;
  
  if (0 < n) {
    if (incy == 1 && incx == 1) {
      for (lVar6 = 0; (ulong)(uint)n << 4 != lVar6; lVar6 = lVar6 + 0x10) {
        dVar1 = *(double *)(cx->_M_value + lVar6);
        dVar2 = *(double *)(cx->_M_value + lVar6 + 8);
        dVar3 = *(double *)(cy->_M_value + lVar6);
        dVar4 = *(double *)(cy->_M_value + lVar6 + 8);
        *(double *)(cy->_M_value + lVar6) = dVar3 * c - dVar1 * s;
        *(double *)(cy->_M_value + lVar6 + 8) = dVar4 * c - dVar2 * s;
        *(double *)(cx->_M_value + lVar6) = dVar3 * s + dVar1 * c;
        *(double *)(cx->_M_value + lVar6 + 8) = dVar4 * s + dVar2 * c;
      }
    }
    else {
      pdVar7 = (double *)(cx[incx >> 0x1f & (1 - n) * incx]._M_value + 8);
      pdVar5 = (double *)(cy[incy >> 0x1f & (1 - n) * incy]._M_value + 8);
      while (bVar8 = n != 0, n = n + -1, bVar8) {
        dVar1 = pdVar7[-1];
        dVar2 = *pdVar7;
        dVar3 = pdVar5[-1];
        dVar4 = *pdVar5;
        pdVar5[-1] = dVar3 * c - dVar1 * s;
        *pdVar5 = dVar4 * c - dVar2 * s;
        pdVar7[-1] = dVar3 * s + dVar1 * c;
        *pdVar7 = dVar4 * s + dVar2 * c;
        pdVar7 = pdVar7 + (long)incx * 2;
        pdVar5 = pdVar5 + (long)incy * 2;
      }
    }
  }
  return;
}

Assistant:

void zdrot ( int n, complex <double> cx[], int incx, complex <double> cy[],
  int incy, double c, double s )

//****************************************************************************80
//
//  Purpose:
//
//    ZDROT applies a plane rotation to complex <double> vectors.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    The cosine C and sine S are real and the vectors CX and CY are complex.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, complex <double> CX[], one of the vectors to be rotated.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <double> CY[], one of the vectors to be rotated.
//
//    Input, int INCY, the increment between successive elements of CY.
//
//    Input, double C, S, parameters (presumably the cosine and sine of
//    some angle) that define a plane rotation.
//
{
  complex <double> ctemp;
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      ctemp = c * cx[i] + s * cy[i];
      cy[i] = c * cy[i] - s * cx[i];
      cx[i] = ctemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      ctemp  = c * cx[ix] + s * cy[iy];
      cy[iy] = c * cy[iy] - s * cx[ix];
      cx[ix] = ctemp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return;
}